

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cc
# Opt level: O0

t_object * xemmai::t_map::f_instantiate(void)

{
  t_global *this;
  t_object *ptVar1;
  t_type *local_18;
  t_global *local_10;
  t_global *global;
  
  this = f_global();
  local_10 = this;
  local_18 = t_global::f_type<xemmai::t_map::t_table>(this);
  ptVar1 = f_new<xemmai::t_map,xemmai::t_global,xemmai::t_type_of<xemmai::t_object>*>
                     (this,&local_18);
  return ptVar1;
}

Assistant:

t_object* t_map::f_instantiate()
{
	auto global = f_global();
	return f_new<t_map>(global, global->f_type<t_map::t_table>());
}